

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,BlockStatementSyntax *syntax)

{
  NamedBlockClauseSyntax *pNVar1;
  StatementBlockKind SVar2;
  SourceLocation SVar3;
  StatementBlockSymbol *pSVar4;
  SyntaxList<slang::syntax::SyntaxNode> *items;
  SourceLocation loc;
  string_view sVar5;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar6;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffb0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  pNVar1 = syntax->blockName;
  if (pNVar1 == (NamedBlockClauseSyntax *)0x0) {
    SVar3 = parsing::Token::location(&syntax->begin);
    getLabel(&local_48,&syntax->super_StatementSyntax,SVar3);
    sVar5._M_str = local_48.first._M_str;
    sVar5._M_len = local_48.first._M_len;
    SVar3 = local_48.second;
  }
  else {
    local_48.first._M_len._0_2_ = (pNVar1->name).kind;
    local_48.first._M_len._2_1_ = (pNVar1->name).field_0x2;
    local_48.first._M_len._3_1_ = (pNVar1->name).numFlags;
    local_48.first._M_len._4_4_ = (pNVar1->name).rawLen;
    local_48.first._M_str = (char *)(pNVar1->name).info;
    sVar5 = parsing::Token::valueText((Token *)&local_48);
    SVar3 = parsing::Token::location((Token *)&local_48);
  }
  SVar2 = SemanticFacts::getStatementBlockKind(syntax);
  loc._4_4_ = 0;
  loc._0_4_ = SVar2;
  name._M_str = (char *)SVar3;
  name._M_len = (size_t)sVar5._M_str;
  pSVar4 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar5._M_len,name,loc,
                       Sequential,(optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffb0)
  ;
  sVar6 = Statement::createAndAddBlockItems
                    ((Statement *)&pSVar4->super_Scope,(Scope *)&syntax->items,items);
  pSVar4->blocks = sVar6;
  return pSVar4;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const BlockStatementSyntax& syntax) {
    string_view name;
    SourceLocation loc;
    if (syntax.blockName) {
        auto token = syntax.blockName->name;
        name = token.valueText();
        loc = token.location();
    }
    else {
        std::tie(name, loc) = getLabel(syntax, syntax.begin.location());
    }

    auto result = createBlock(scope, syntax, name, loc,
                              SemanticFacts::getStatementBlockKind(syntax));

    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);
    return *result;
}